

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::successOrFailColoredStringToStream
          (ConsoleReporter *this,bool success,Enum at,char *success_str)

{
  size_t sVar1;
  Enum EVar2;
  Enum code;
  undefined7 in_register_00000031;
  char *__s;
  
  EVar2 = (Enum)CONCAT71(in_register_00000031,success);
  code = BrightGreen;
  if (EVar2 == 0) {
    code = (at & is_warn) * 4 + Red;
  }
  __s = "WARNING";
  if (EVar2 != 0) {
    __s = "SUCCESS";
  }
  Color::operator<<((ostream *)this,code);
  if (((EVar2 | at) & is_warn) == 0) {
    if ((at & is_check) == 0) {
      __s = "FATAL ERROR";
      if ((at & is_require) == 0) {
        __s = "";
      }
    }
    else {
      __s = "ERROR";
    }
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,": ",2);
  return;
}

Assistant:

void successOrFailColoredStringToStream(bool success, assertType::Enum at,
                                                const char* success_str = "SUCCESS") {
            s << getSuccessOrFailColor(success, at)
              << getSuccessOrFailString(success, at, success_str) << ": ";
        }